

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O2

void leveldb::PutLengthPrefixedSlice(string *dst,Slice *value)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  PutVarint32(dst,(uint32_t)value->size_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (dst,value->data_,value->size_);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PutLengthPrefixedSlice(std::string* dst, const Slice& value) {
  PutVarint32(dst, value.size());
  dst->append(value.data(), value.size());
}